

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O2

bool __thiscall buffer::push_data(buffer *this,char *data,int len)

{
  int count;
  
  count = (*(int *)&this->end_ - *(int *)&this->begin_) + len;
  if (count < 0x800001) {
    reserve(this,count);
    memcpy(this->end_,data,(long)len);
    this->end_ = this->end_ + len;
  }
  return count < 0x800001;
}

Assistant:

int buffer::size()
{
    return end_ - begin_;
}